

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O3

MPP_RET rga_copy(RgaCtx ctx,MppFrame src,MppFrame dst)

{
  undefined2 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MppFrameFormat MVar8;
  RgaFormat RVar9;
  RgaFormat RVar10;
  MPP_RET MVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 uVar14;
  RgaCtxImpl *impl;
  short sVar15;
  short sVar16;
  
  uVar12 = mpp_frame_get_buffer(src);
  uVar13 = mpp_frame_get_buffer(dst);
  iVar2 = mpp_frame_get_width(src);
  iVar3 = mpp_frame_get_height(src);
  iVar4 = mpp_frame_get_width(dst);
  iVar5 = mpp_frame_get_height(dst);
  iVar6 = mpp_buffer_get_fd_with_caller(uVar12,"rga_copy");
  iVar7 = mpp_buffer_get_fd_with_caller(uVar13);
  MVar8 = mpp_frame_get_fmt(src);
  RVar9 = rga_fmt_map(MVar8);
  MVar8 = mpp_frame_get_fmt(dst);
  RVar10 = rga_fmt_map(MVar8);
  if (RGA_FMT_BPP8 < RVar9 || RGA_FMT_BPP8 < RVar10) {
    _mpp_log_l(2,0,"invalid input format for rga process src %d dst %d\n",0,RVar9);
    return MPP_NOK;
  }
  if (iVar2 == 0 || iVar3 == 0) {
    _mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"src_w > 0 && src_h > 0","rga_copy",0x136);
    if ((DAT_0010f143 & 0x10) != 0) {
      abort();
    }
  }
  memset((void *)((long)ctx + 8),0,0x128);
  *(long *)((long)ctx + 0x10) = (long)iVar6;
  *(RgaFormat *)((long)ctx + 0x28) = RVar9;
  uVar1 = mpp_frame_get_hor_stride(src);
  *(undefined2 *)((long)ctx + 0x34) = uVar1;
  uVar1 = mpp_frame_get_ver_stride(src);
  *(undefined2 *)((long)ctx + 0x36) = uVar1;
  *(short *)((long)ctx + 0x2c) = (short)iVar2;
  *(short *)((long)ctx + 0x2e) = (short)iVar3;
  *(long *)((long)ctx + 0x40) = (long)iVar7;
  iVar6 = iVar4;
  if (iVar5 == 0 || iVar4 == 0) {
    iVar6 = iVar2;
  }
  sVar15 = (short)iVar6;
  *(short *)((long)ctx + 100) = sVar15;
  if (iVar5 == 0 || iVar4 == 0) {
    iVar5 = iVar3;
  }
  sVar16 = (short)iVar5;
  *(short *)((long)ctx + 0x66) = sVar16;
  *(RgaFormat *)((long)ctx + 0x58) = RVar10;
  *(undefined2 *)((long)ctx + 0xb0) = 0;
  *(short *)((long)ctx + 0xb2) = sVar15 + -1;
  *(undefined2 *)((long)ctx + 0xb4) = 0;
  *(short *)((long)ctx + 0xb6) = sVar16 + -1;
  *(short *)((long)ctx + 0x5c) = sVar15;
  *(short *)((long)ctx + 0x5e) = sVar16;
  *(undefined1 *)((long)ctx + 0x102) = 0;
  uVar14 = 1;
  if ((RVar10 < RGA_FMT_YCbCr_422_SP && (*(uint *)((long)ctx + 0x28) & 0xfffffff8) == 8) ||
     (uVar14 = 0x20,
     (RVar10 & ~RGA_FMT_BGR_888) == RGA_FMT_YCbCr_422_SP && *(uint *)((long)ctx + 0x28) < 8)) {
    *(undefined1 *)((long)ctx + 0x102) = uVar14;
  }
  *(undefined1 *)((long)ctx + 0x108) = 1;
  *(undefined4 *)((long)ctx + 0x118) = 0x80000521;
  MVar11 = rga_ioctl((RgaCtxImpl *)ctx);
  return MVar11;
}

Assistant:

MPP_RET rga_copy(RgaCtx ctx, MppFrame src, MppFrame dst)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = (RgaCtxImpl *)ctx;
    MppBuffer src_buf = mpp_frame_get_buffer(src);
    MppBuffer dst_buf = mpp_frame_get_buffer(dst);
    RK_U32 src_w = mpp_frame_get_width(src);
    RK_U32 src_h = mpp_frame_get_height(src);
    RK_U32 dst_w = mpp_frame_get_width(dst);
    RK_U32 dst_h = mpp_frame_get_height(dst);
    RK_S32 src_fd = mpp_buffer_get_fd(src_buf);
    RK_S32 dst_fd = mpp_buffer_get_fd(dst_buf);
    RgaReq *request = &impl->request;

    RgaFormat src_fmt = rga_fmt_map(mpp_frame_get_fmt(src));
    RgaFormat dst_fmt = rga_fmt_map(mpp_frame_get_fmt(dst));

    rga_dbg_func("in\n");

    if (src_fmt >= RGA_FMT_BUTT || dst_fmt >= RGA_FMT_BUTT) {
        mpp_err("invalid input format for rga process src %d dst %d\n",
                src_fmt, dst_fmt);
        ret = MPP_NOK;
        goto END;
    }

    mpp_assert(src_w > 0 && src_h > 0);

    if (dst_w == 0 || dst_h == 0) {
        dst_w = src_w;
        dst_h = src_h;
    }

    rga_dbg_copy("[fd:w:h:fmt] src - %d:%d:%d:%d dst - %d:%d:%d:%d\n",
                 src_fd, src_w, src_h, src_fmt,
                 dst_fd, dst_w, dst_h, dst_fmt);

    memset(request, 0, sizeof(*request));
    request->src.yrgb_addr = src_fd;
    request->src.format = (RK_U32)src_fmt;
    request->src.vir_w = mpp_frame_get_hor_stride(src);
    request->src.vir_h = mpp_frame_get_ver_stride(src);
    request->src.act_w = src_w;
    request->src.act_h = src_h;

    request->dst.yrgb_addr = dst_fd;
    request->dst.vir_w = dst_w;
    request->dst.vir_h = dst_h;
    request->dst.format = (RK_U32)dst_fmt;
    request->clip.xmin = 0;
    request->clip.xmax = dst_w - 1;
    request->clip.ymin = 0;
    request->clip.ymax = dst_h - 1;
    request->dst.act_w = dst_w;
    request->dst.act_h = dst_h;

    config_rga_yuv2rgb_mode(ctx);

    request->mmu_info.mmu_en = 1;
    request->mmu_info.mmu_flag = 1;
    request->mmu_info.mmu_flag = ((2 & 0x3) << 4) | 1;
    request->mmu_info.mmu_flag |= (1 << 31) | (1 << 10) | (1 << 8);

    ret = rga_ioctl(impl);
END:
    rga_dbg_func("out\n");
    return ret;
}